

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  size_type sVar2;
  bool ord_output;
  bool all_idx;
  bool remove_zero_exposure_records;
  bool skipheader;
  bool fullprecision;
  bool show_exposure_value;
  int iVar3;
  undefined8 extraout_RAX;
  bool bVar4;
  string parquetOutFile;
  string local_90;
  string local_70;
  string local_50;
  
  parquetOutFile._M_dataplus._M_p = (pointer)&parquetOutFile.field_2;
  parquetOutFile._M_string_length = 0;
  parquetOutFile.field_2._M_local_buf[0] = '\0';
  skipheader = false;
  fullprecision = false;
  show_exposure_value = false;
  remove_zero_exposure_records = false;
  ord_output = false;
  bVar4 = false;
  all_idx = false;
  do {
    iVar3 = getopt(argc,argv,"zvhfseoap:");
    sVar2 = parquetOutFile._M_string_length;
    pcVar1 = _optarg;
    switch(iVar3) {
    case 0x6f:
      ord_output = true;
      break;
    case 0x70:
      strlen(_optarg);
      bVar4 = true;
      std::__cxx11::string::_M_replace((ulong)&parquetOutFile,0,(char *)sVar2,(ulong)pcVar1);
      break;
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x78:
    case 0x79:
      break;
    case 0x73:
      skipheader = true;
      break;
    case 0x76:
      main_cold_2();
switchD_00101b7e_caseD_68:
      main_cold_1();
LAB_00101d3e:
      main_cold_3();
      if (local_50._M_dataplus._M_p != "zvhfseoap:") {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)parquetOutFile._M_dataplus._M_p != &parquetOutFile.field_2) {
        operator_delete(parquetOutFile._M_dataplus._M_p);
      }
      _Unwind_Resume(extraout_RAX);
    case 0x7a:
      remove_zero_exposure_records = true;
      break;
    default:
      switch(iVar3) {
      case 0x61:
        all_idx = true;
        break;
      case 0x62:
      case 99:
      case 100:
      case 0x67:
        break;
      case 0x65:
        show_exposure_value = true;
        break;
      case 0x66:
        fullprecision = true;
        break;
      case 0x68:
        goto switchD_00101b7e_caseD_68;
      default:
        if (iVar3 == -1) {
          if (!bVar4) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
            initstreams(&local_70,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,parquetOutFile._M_dataplus._M_p,
                       parquetOutFile._M_dataplus._M_p + parquetOutFile._M_string_length);
            doit(skipheader,fullprecision,show_exposure_value,remove_zero_exposure_records,
                 ord_output,all_idx,false,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)parquetOutFile._M_dataplus._M_p != &parquetOutFile.field_2) {
              operator_delete(parquetOutFile._M_dataplus._M_p);
            }
            return 0;
          }
          goto LAB_00101d3e;
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	bool skipheader = false;
	bool fullprecision = false;
	bool show_exposure_value = false;
	bool remove_zero_exposure_records = false;
	bool ord_output = false;   // csv output
	bool parquet_output = false;   // parquet output
	std::string parquetOutFile;   // parquet output
	bool all_idx = false;
	while ((opt = getopt(argc, argv, "zvhfseoap:")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'f':
			fullprecision = true;
			break;
		case 'e':
			show_exposure_value = true;
			break;
		case 'z':
			remove_zero_exposure_records = true;
			break;
		case 'o':
			ord_output = true;
			break;
		case 'p':
			parquet_output = true;
			parquetOutFile = optarg;
			break;
		case 'a':
			all_idx = true;
			break;
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquet_output) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

	initstreams();
	doit(skipheader, fullprecision, show_exposure_value,
	     remove_zero_exposure_records, ord_output, all_idx, parquet_output,
	     parquetOutFile);
	return EXIT_SUCCESS;
}